

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_tar.c
# Opt level: O0

wchar_t header_longlink(archive_read *a,tar *tar,archive_entry *entry,void *h,size_t *unconsumed)

{
  wchar_t err;
  size_t *unconsumed_local;
  void *h_local;
  archive_entry *entry_local;
  tar *tar_local;
  archive_read *a_local;
  
  a_local._4_4_ = read_body_to_string(a,tar,&tar->longlink,h,unconsumed);
  if ((a_local._4_4_ == L'\0') &&
     ((a_local._4_4_ = tar_read_header(a,tar,entry,unconsumed), a_local._4_4_ == L'\0' ||
      (a_local._4_4_ == L'\xffffffec')))) {
    archive_entry_copy_link(entry,(tar->longlink).s);
    a_local._4_4_ = L'\0';
  }
  return a_local._4_4_;
}

Assistant:

static int
header_longlink(struct archive_read *a, struct tar *tar,
    struct archive_entry *entry, const void *h, size_t *unconsumed)
{
	int err;

	err = read_body_to_string(a, tar, &(tar->longlink), h, unconsumed);
	if (err != ARCHIVE_OK)
		return (err);
	err = tar_read_header(a, tar, entry, unconsumed);
	if ((err != ARCHIVE_OK) && (err != ARCHIVE_WARN))
		return (err);
	/* Set symlink if symlink already set, else hardlink. */
	archive_entry_copy_link(entry, tar->longlink.s);
	return (ARCHIVE_OK);
}